

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m68kops.c
# Opt level: O1

void m68k_op_dbmi_16(void)

{
  uint uVar1;
  uint *puVar2;
  uint uVar3;
  
  if (((byte)m68ki_cpu.n_flag & 0x80) == 0) {
    uVar3 = m68ki_cpu.dar[m68ki_cpu.ir & 7];
    *(short *)(m68ki_cpu.dar + (m68ki_cpu.ir & 7)) = (short)uVar3 + -1;
    if ((-uVar3 & 0xffff) == 0) {
      puVar2 = &m68ki_cpu.cyc_dbcc_f_exp;
      m68ki_cpu.pc = m68ki_cpu.pc + 2;
    }
    else {
      my_fc_handler(m68ki_cpu.s_flag | 2);
      uVar3 = m68ki_cpu.pc & m68ki_cpu.address_mask;
      m68ki_cpu.pc = m68ki_cpu.pc + 2;
      my_fc_handler(m68ki_cpu.s_flag | 2);
      if (m68ki_cpu.pmmu_enabled != 0) {
        uVar3 = pmmu_translate_addr(uVar3);
      }
      uVar1 = m68k_read_memory_16(uVar3 & m68ki_cpu.address_mask);
      m68ki_cpu.pc = ((int)(short)uVar1 + m68ki_cpu.pc) - 2;
      puVar2 = &m68ki_cpu.cyc_dbcc_f_noexp;
    }
    m68ki_remaining_cycles = m68ki_remaining_cycles - *puVar2;
  }
  else {
    m68ki_cpu.pc = m68ki_cpu.pc + 2;
  }
  return;
}

Assistant:

static void m68k_op_dbmi_16(void)
{
	if(COND_NOT_MI())
	{
		uint* r_dst = &DY;
		uint res = MASK_OUT_ABOVE_16(*r_dst - 1);

		*r_dst = MASK_OUT_BELOW_16(*r_dst) | res;
		if(res != 0xffff)
		{
			uint offset = OPER_I_16();
			REG_PC -= 2;
			m68ki_trace_t0();			   /* auto-disable (see m68kcpu.h) */
			m68ki_branch_16(offset);
			USE_CYCLES(CYC_DBCC_F_NOEXP);
			return;
		}
		REG_PC += 2;
		USE_CYCLES(CYC_DBCC_F_EXP);
		return;
	}
	REG_PC += 2;
}